

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndtri.c
# Opt level: O0

double hcephes_ndtri(double y0)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dStack_48;
  int code;
  double x1;
  double x0;
  double y2;
  double z;
  double y;
  double x;
  double y0_local;
  
  if (0.0 < y0) {
    if (y0 < 1.0) {
      z = y0;
      if (0.8646647167633873 < y0) {
        z = 1.0 - y0;
      }
      if (z <= 0.1353352832366127) {
        dVar1 = log(z);
        dVar1 = sqrt(dVar1 * -2.0);
        dVar2 = log(dVar1);
        dVar3 = 1.0 / dVar1;
        if (8.0 <= dVar1) {
          dVar4 = hcephes_polevl(dVar3,P2,8);
          dStack_48 = hcephes_p1evl(dVar3,Q2,8);
          dStack_48 = (dVar3 * dVar4) / dStack_48;
        }
        else {
          dVar4 = hcephes_polevl(dVar3,P1,8);
          dStack_48 = hcephes_p1evl(dVar3,Q1,8);
          dStack_48 = (dVar3 * dVar4) / dStack_48;
        }
        y = (dVar1 - dVar2 / dVar1) - dStack_48;
        if (0.8646647167633873 >= y0) {
          y = -y;
        }
        y0_local = y;
      }
      else {
        dVar1 = z - 0.5;
        dVar2 = dVar1 * dVar1;
        dVar3 = hcephes_polevl(dVar2,P0,4);
        dVar4 = hcephes_p1evl(dVar2,Q0,8);
        y0_local = (dVar1 * ((dVar2 * dVar3) / dVar4) + dVar1) * s2pi;
      }
    }
    else {
      hcephes_mtherr("ndtri",1);
      y0_local = INFINITY;
    }
  }
  else {
    hcephes_mtherr("ndtri",1);
    y0_local = -INFINITY;
  }
  return y0_local;
}

Assistant:

HCEPHES_API double hcephes_ndtri(double y0) {
    double x, y, z, y2, x0, x1;
    int code;

    if (y0 <= 0.0) {
        hcephes_mtherr("ndtri", HCEPHES_DOMAIN);
        return (-HUGE_VAL);
    }
    if (y0 >= 1.0) {
        hcephes_mtherr("ndtri", HCEPHES_DOMAIN);
        return (HUGE_VAL);
    }
    code = 1;
    y = y0;
    if (y > (1.0 - 0.13533528323661269189)) /* 0.135... = exp(-2) */
    {
        y = 1.0 - y;
        code = 0;
    }

    if (y > 0.13533528323661269189) {
        y = y - 0.5;
        y2 = y * y;
        x = y + y * (y2 * hcephes_polevl(y2, P0, 4) / hcephes_p1evl(y2, Q0, 8));
        x = x * s2pi;
        return (x);
    }

    x = sqrt(-2.0 * log(y));
    x0 = x - log(x) / x;

    z = 1.0 / x;
    if (x < 8.0) /* y > exp(-32) = 1.2664165549e-14 */
        x1 = z * hcephes_polevl(z, P1, 8) / hcephes_p1evl(z, Q1, 8);
    else
        x1 = z * hcephes_polevl(z, P2, 8) / hcephes_p1evl(z, Q2, 8);
    x = x0 - x1;
    if (code != 0)
        x = -x;
    return (x);
}